

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cnfMan.c
# Opt level: O1

void Cnf_DataTranformPolarity(Cnf_Dat_t *pCnf,int fTransformPos)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  void **ppvVar3;
  void *pvVar4;
  int *piVar5;
  void *__ptr;
  long lVar6;
  long lVar7;
  int iVar8;
  
  __ptr = calloc((long)pCnf->nVars,4);
  pVVar2 = pCnf->pMan->vObjs;
  lVar6 = (long)pVVar2->nSize;
  if (0 < lVar6) {
    ppvVar3 = pVVar2->pArray;
    lVar7 = 0;
    do {
      pvVar4 = ppvVar3[lVar7];
      if ((pvVar4 != (void *)0x0) &&
         (((fTransformPos != 0 || ((*(uint *)((long)pvVar4 + 0x18) & 7) != 3)) &&
          (-1 < (long)pCnf->pVarNums[*(int *)((long)pvVar4 + 0x24)])))) {
        *(uint *)((long)__ptr + (long)pCnf->pVarNums[*(int *)((long)pvVar4 + 0x24)] * 4) =
             *(uint *)((long)pvVar4 + 0x18) >> 3 & 1;
      }
      lVar7 = lVar7 + 1;
    } while (lVar6 != lVar7);
  }
  if (0 < pCnf->nLiterals) {
    piVar5 = *pCnf->pClauses;
    lVar6 = 0;
    do {
      uVar1 = piVar5[lVar6];
      iVar8 = (int)uVar1 >> 1;
      if (pCnf->nVars <= iVar8) {
        __assert_fail("iVar < pCnf->nVars",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/cnf/cnfMan.c"
                      ,0x29e,"void Cnf_DataTranformPolarity(Cnf_Dat_t *, int)");
      }
      if (*(int *)((long)__ptr + (long)iVar8 * 4) != 0) {
        piVar5[lVar6] = uVar1 ^ 1;
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < pCnf->nLiterals);
  }
  if (__ptr != (void *)0x0) {
    free(__ptr);
    return;
  }
  return;
}

Assistant:

void Cnf_DataTranformPolarity( Cnf_Dat_t * pCnf, int fTransformPos )
{
    Aig_Obj_t * pObj;
    int * pVarToPol;
    int i, iVar;
    // create map from the variable number to its polarity
    pVarToPol = ABC_CALLOC( int, pCnf->nVars );
    Aig_ManForEachObj( pCnf->pMan, pObj, i )
    {
        if ( !fTransformPos && Aig_ObjIsCo(pObj) )
            continue;
        if ( pCnf->pVarNums[pObj->Id] >= 0 )
            pVarToPol[ pCnf->pVarNums[pObj->Id] ] = pObj->fPhase;
    }
    // transform literals
    for ( i = 0; i < pCnf->nLiterals; i++ )
    {
        iVar = lit_var(pCnf->pClauses[0][i]);
        assert( iVar < pCnf->nVars );
        if ( pVarToPol[iVar] )
            pCnf->pClauses[0][i] = lit_neg( pCnf->pClauses[0][i] );
    }
    ABC_FREE( pVarToPol );
}